

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

int64_t __thiscall
icu_63::CollationIterator::previousCE
          (CollationIterator *this,UVector32 *offsets,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  ulong uVar6;
  int iVar7;
  CollationData *this_00;
  
  iVar3 = (this->ceBuffer).length;
  if (iVar3 < 1) {
    UVector32::removeAllElements(offsets);
    iVar3 = (*(this->super_UObject)._vptr_UObject[5])(this);
    iVar4 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (iVar4 < 0) {
      uVar6 = 0x101000100;
    }
    else {
      iVar7 = iVar4;
      UVar1 = CollationData::isUnsafeBackward(this->data,iVar4,this->isNumeric);
      if (UVar1 != '\0') {
        iVar5 = previousCEUnsafe(this,iVar7,offsets,errorCode);
        return iVar5;
      }
      uVar2 = CollationData::getCE32(this->data,iVar4);
      this_00 = this->data;
      if (uVar2 == 0xc0) {
        this_00 = this_00->base;
        uVar2 = CollationData::getCE32(this_00,iVar4);
      }
      if (((~uVar2 & 0xc0) == 0) && (1 < (uVar2 & 0xf) - 1)) {
        appendCEsFromCE32(this,this_00,iVar4,uVar2,'\0',errorCode);
        uVar6 = 1;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar4 = (this->ceBuffer).length;
          if (1 < iVar4) {
            iVar4 = (*(this->super_UObject)._vptr_UObject[5])(this);
            UVector32::addElement(offsets,iVar4,errorCode);
            iVar7 = offsets->count;
LAB_002319db:
            iVar4 = (this->ceBuffer).length;
            if (iVar7 <= iVar4) {
              if ((iVar7 < -1) || (offsets->capacity <= iVar7)) goto LAB_002319ed;
              goto LAB_00231a02;
            }
          }
          (this->ceBuffer).length = iVar4 + -1;
          uVar6 = (this->ceBuffer).buffer.ptr[(long)iVar4 + -1];
        }
      }
      else if ((uVar2 & 0xff) < 0xc0) {
        uVar6 = (ulong)((uVar2 & 0xff) << 8) | CONCAT44(uVar2,uVar2 << 0x10) & 0xffff0000ff000000;
      }
      else {
        uVar6 = (ulong)(uVar2 & 0xffffff00);
        if ((uVar2 & 0xf) == 1) {
          uVar6 = uVar6 << 0x20 | 0x5000500;
        }
      }
    }
  }
  else {
    uVar2 = iVar3 - 1;
    (this->ceBuffer).length = uVar2;
    uVar6 = (this->ceBuffer).buffer.ptr[uVar2];
  }
  return uVar6;
LAB_002319ed:
  UVar1 = UVector32::expandCapacity(offsets,iVar7 + 1,errorCode);
  iVar7 = offsets->count;
  if (UVar1 != '\0') {
LAB_00231a02:
    offsets->elements[iVar7] = iVar3;
    iVar7 = offsets->count + 1;
    offsets->count = iVar7;
  }
  goto LAB_002319db;
}

Assistant:

int64_t
CollationIterator::previousCE(UVector32 &offsets, UErrorCode &errorCode) {
    if(ceBuffer.length > 0) {
        // Return the previous buffered CE.
        return ceBuffer.get(--ceBuffer.length);
    }
    offsets.removeAllElements();
    int32_t limitOffset = getOffset();
    UChar32 c = previousCodePoint(errorCode);
    if(c < 0) { return Collation::NO_CE; }
    if(data->isUnsafeBackward(c, isNumeric)) {
        return previousCEUnsafe(c, offsets, errorCode);
    }
    // Simple, safe-backwards iteration:
    // Get a CE going backwards, handle prefixes but no contractions.
    uint32_t ce32 = data->getCE32(c);
    const CollationData *d;
    if(ce32 == Collation::FALLBACK_CE32) {
        d = data->base;
        ce32 = d->getCE32(c);
    } else {
        d = data;
    }
    if(Collation::isSimpleOrLongCE32(ce32)) {
        return Collation::ceFromCE32(ce32);
    }
    appendCEsFromCE32(d, c, ce32, FALSE, errorCode);
    if(U_SUCCESS(errorCode)) {
        if(ceBuffer.length > 1) {
            offsets.addElement(getOffset(), errorCode);
            // For an expansion, the offset of each non-initial CE is the limit offset,
            // consistent with forward iteration.
            while(offsets.size() <= ceBuffer.length) {
                offsets.addElement(limitOffset, errorCode);
            };
        }
        return ceBuffer.get(--ceBuffer.length);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}